

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_literal
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel,bool explicit_key,bool explicit_indentation)

{
  size_t *psVar1;
  code *pcVar2;
  error_flags eVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  undefined3 in_register_00000081;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  basic_substring<const_char> bVar16;
  ro_substr chars;
  basic_substring<const_char> local_58;
  basic_substring<const_char> local_48;
  long local_38;
  
  local_48.len = s.len;
  local_48.str = s.str;
  if (CONCAT31(in_register_00000081,explicit_key) != 0) {
    std::ostream::write((char *)((this->
                                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ).m_stream + 0x10),0x246bb5);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 2;
  }
  chars.len = 2;
  chars.str = "\n\r";
  bVar16 = basic_substring<const_char>::trimr(&local_48,chars);
  uVar14 = bVar16.len;
  pcVar4 = bVar16.str;
  lVar5 = local_48.len - uVar14;
  if (local_48.len < uVar14) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x2467aa,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring
            (&local_58,local_48.str + uVar14,local_48.len - uVar14);
  lVar12 = 0;
  sVar6 = basic_substring<const_char>::first_of(&local_58,'\r',0);
  if (sVar6 != 0xffffffffffffffff) {
    lVar12 = 0;
    do {
      sVar6 = basic_substring<const_char>::first_of(&local_58,'\r',sVar6 + 1);
      lVar12 = lVar12 + -1;
    } while (sVar6 != 0xffffffffffffffff);
  }
  uVar7 = lVar5 + lVar12;
  pbVar9 = (this->
           super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).m_stream + 0x10;
  if (explicit_indentation) {
    lVar5 = 2;
    std::ostream::write((char *)pbVar9,0x246bb8);
  }
  else {
    std::ostream::put((char)pbVar9);
    lVar5 = 1;
  }
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + lVar5;
  if ((uVar7 < 2) && ((uVar14 != 0 || (local_48.len == 0)))) {
    pbVar9 = (this->
             super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).m_stream + 0x10;
    if (uVar7 != 1) {
      pcVar8 = "-\n";
      goto LAB_001d7677;
    }
    std::ostream::put((char)pbVar9);
    lVar5 = 1;
  }
  else {
    pbVar9 = (this->
             super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).m_stream + 0x10;
    pcVar8 = "+\n";
LAB_001d7677:
    lVar5 = 2;
    std::ostream::write((char *)pbVar9,(long)pcVar8);
  }
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + lVar5;
  if (uVar14 == 0) {
LAB_001d78e1:
    bVar15 = uVar7 == 0;
    if (!bVar15) {
      uVar14 = 0;
      do {
        lVar5 = ilevel + 1;
        if (ilevel != 0xffffffffffffffff) {
          do {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        uVar14 = uVar14 + 1;
        if (uVar14 < uVar7 || explicit_key) {
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
        }
      } while (uVar14 != uVar7);
      goto LAB_001d7963;
    }
  }
  else {
    local_38 = ilevel + 1;
    uVar13 = 0;
    uVar10 = 0;
    do {
      pcVar8 = pcVar4 + uVar10;
      uVar10 = uVar10 + 1;
      if (*pcVar8 == '\n') {
        if (uVar14 < uVar13) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x2467aa,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar11 = uVar10;
        if (uVar10 == 0xffffffffffffffff) {
          uVar11 = uVar14;
        }
        if (uVar11 < uVar13) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x2467aa,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar14 < uVar11) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x2467aa,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_58,pcVar4 + uVar13,uVar11 - uVar13);
        sVar6 = local_58.len;
        pcVar8 = local_58.str;
        lVar5 = local_38;
        if (ilevel != 0xffffffffffffffff) {
          do {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        uVar13 = uVar10;
        if (pcVar8 != (char *)0x0 && sVar6 != 0) {
          std::ostream::write((char *)((this->
                                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).m_stream + 0x10),(long)pcVar8);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar6;
        }
      }
    } while (uVar10 != uVar14);
    if (uVar13 <= uVar14 && uVar14 - uVar13 != 0) {
      if (ilevel != 0xffffffffffffffff) {
        lVar5 = ilevel + 1;
        do {
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      basic_substring<const_char>::basic_substring(&local_58,pcVar4 + uVar13,uVar14 - uVar13);
      if (local_58.str != (char *)0x0 && local_58.len != 0) {
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),(long)local_58.str);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + local_58.len;
      }
    }
    if (uVar7 != 0) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
      uVar7 = uVar7 - 1;
      goto LAB_001d78e1;
    }
  }
  bVar15 = true;
LAB_001d7963:
  if ((bVar15 & explicit_key) != 0) {
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_literal(csubstr s, size_t ilevel, bool explicit_key, bool explicit_indentation)
{
    if(explicit_key)
        this->Writer::_do_write("? ");
    csubstr trimmed = s.trimr("\n\r");
    size_t numnewlines_at_end = s.len - trimmed.len - s.sub(trimmed.len).count('\r');
    //
    if(!explicit_indentation)
        this->Writer::_do_write('|');
    else
        this->Writer::_do_write("|2");
    //
    if(numnewlines_at_end > 1 || (trimmed.len == 0 && s.len > 0)/*only newlines*/)
        this->Writer::_do_write("+\n");
    else if(numnewlines_at_end == 1)
        this->Writer::_do_write('\n');
    else
        this->Writer::_do_write("-\n");
    //
    if(trimmed.len)
    {
        size_t pos = 0; // tracks the last character that was already written
        for(size_t i = 0; i < trimmed.len; ++i)
        {
            if(trimmed[i] != '\n')
                continue;
            // write everything up to this point
            csubstr since_pos = trimmed.range(pos, i+1); // include the newline
            _rymlindent_nextline()
            this->Writer::_do_write(since_pos);
            pos = i+1; // already written
        }
        if(pos < trimmed.len)
        {
            _rymlindent_nextline()
            this->Writer::_do_write(trimmed.sub(pos));
        }
        if(numnewlines_at_end)
        {
            this->Writer::_do_write('\n');
            --numnewlines_at_end;
        }
    }
    for(size_t i = 0; i < numnewlines_at_end; ++i)
    {
        _rymlindent_nextline()
        if(i+1 < numnewlines_at_end || explicit_key)
            this->Writer::_do_write('\n');
    }
    if(explicit_key && !numnewlines_at_end)
        this->Writer::_do_write('\n');
}